

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysp_ident_free(lysf_ctx *ctx,lysp_ident *ident)

{
  lysp_qname *plVar1;
  char **ppcVar2;
  lysp_ext_instance *plVar3;
  uint64_t c__;
  ulong uVar4;
  lysp_ext_instance *plVar5;
  uint64_t c___1;
  long lVar6;
  char *pcVar7;
  
  lydict_remove(ctx->ctx,ident->name);
  lVar6 = 0;
  uVar4 = 0;
  while (plVar1 = ident->iffeatures, plVar1 != (lysp_qname *)0x0) {
    if (*(ulong *)&plVar1[-1].flags <= uVar4) {
      free(&plVar1[-1].flags);
      break;
    }
    lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar1->str + lVar6));
    uVar4 = uVar4 + 1;
    lVar6 = lVar6 + 0x18;
  }
  pcVar7 = (char *)0x0;
  do {
    ppcVar2 = ident->bases;
    if (ppcVar2 == (char **)0x0) {
LAB_00159423:
      lydict_remove(ctx->ctx,ident->dsc);
      lydict_remove(ctx->ctx,ident->ref);
      lVar6 = 0;
      plVar5 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar3 = ident->exts;
        if (plVar3 == (lysp_ext_instance *)0x0) {
          return;
        }
        if (plVar3[-1].exts <= plVar5) break;
        lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar3->name + lVar6));
        plVar5 = (lysp_ext_instance *)((long)&plVar5->name + 1);
        lVar6 = lVar6 + 0x70;
      }
      free(&plVar3[-1].exts);
      return;
    }
    if (ppcVar2[-1] <= pcVar7) {
      free(ppcVar2 + -1);
      goto LAB_00159423;
    }
    lydict_remove(ctx->ctx,ppcVar2[(long)pcVar7]);
    pcVar7 = pcVar7 + 1;
  } while( true );
}

Assistant:

static void
lysp_ident_free(struct lysf_ctx *ctx, struct lysp_ident *ident)
{
    lydict_remove(ctx->ctx, ident->name);
    FREE_ARRAY(ctx->ctx, ident->iffeatures, lysp_qname_free);
    FREE_STRINGS(ctx->ctx, ident->bases);
    lydict_remove(ctx->ctx, ident->dsc);
    lydict_remove(ctx->ctx, ident->ref);
    FREE_ARRAY(ctx, ident->exts, lysp_ext_instance_free);
}